

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O3

void print_buffer(Pl_Buffer *bp)

{
  Buffer *pBVar1;
  uchar *puVar2;
  size_t sVar3;
  ostream *poVar4;
  size_t sVar5;
  char *pcVar6;
  int in_R8D;
  string local_58;
  Buffer *local_38;
  
  (*(bp->super_Pipeline)._vptr_Pipeline[3])();
  pBVar1 = Pl_Buffer::getBuffer(bp);
  puVar2 = Buffer::getBuffer(pBVar1);
  local_38 = pBVar1;
  sVar3 = Buffer::getSize(pBVar1);
  if (sVar3 != 0) {
    sVar5 = 0;
    do {
      QUtil::uint_to_string_base_abi_cxx11_(&local_58,(QUtil *)(ulong)puVar2[sVar5],0x10,2,in_R8D);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length)
      ;
      pcVar6 = " ";
      if (sVar3 - 1 == sVar5) {
        pcVar6 = "\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  pBVar1 = local_38;
  Buffer::~Buffer(local_38);
  operator_delete(pBVar1,8);
  return;
}

Assistant:

static void
print_buffer(Pl_Buffer* bp)
{
    bp->finish();
    Buffer* b = bp->getBuffer();
    unsigned char const* p = b->getBuffer();
    size_t l = b->getSize();
    for (unsigned long i = 0; i < l; ++i) {
        std::cout << QUtil::uint_to_string_base(p[i], 16, 2) << ((i == l - 1) ? "\n" : " ");
    }
    std::cout << std::endl;
    delete b;
}